

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int float64_is_quiet_nan_m68k(float64 a_,float_status *status)

{
  flag fVar1;
  bool local_29;
  uint64_t a;
  float_status *status_local;
  float64 a__local;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_29 = 0xffefffffffffffff < a_ << 1;
  }
  else {
    local_29 = (a_ >> 0x33 & 0xfff) == 0xffe && (a_ & 0x7ffffffffffff) != 0;
  }
  a__local._4_4_ = (uint)local_29;
  return a__local._4_4_;
}

Assistant:

int float64_is_quiet_nan(float64 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float64_is_any_nan(a_);
#else
    uint64_t a = float64_val(a_);
    if (snan_bit_is_one(status)) {
        return (((a >> 51) & 0xFFF) == 0xFFE)
            && (a & 0x0007FFFFFFFFFFFFULL);
    } else {
        return ((a << 1) >= 0xFFF0000000000000ULL);
    }
#endif
}